

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddUtil.c
# Opt level: O2

int Cudd_zddNextPath(DdGen *gen,int **path)

{
  DdManager *pDVar1;
  int *piVar2;
  DdNode **ppDVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  DdNode *pDVar7;
  DdNode *pDVar8;
  
  pDVar1 = gen->manager;
  iVar4 = (gen->stack).sp;
  do {
    if (iVar4 == 1) {
LAB_00749ea0:
      gen->status = 0;
      (gen->stack).sp = 0;
      return 0;
    }
    piVar2 = (gen->gen).cubes.cube;
    ppDVar3 = (gen->stack).stack;
    pDVar8 = *(DdNode **)((uint *)((ulong)ppDVar3[(long)iVar4 + -2] & 0xfffffffffffffffe) + 4);
    uVar5 = *(uint *)((ulong)ppDVar3[(long)iVar4 + -2] & 0xfffffffffffffffe);
    if (pDVar8 != ppDVar3[(long)iVar4 + -1]) {
      piVar2[uVar5] = 1;
      do {
        uVar6 = (ulong)(gen->stack).sp;
        ppDVar3[uVar6 - 1] = pDVar8;
        while( true ) {
          ppDVar3 = (gen->stack).stack;
          pDVar7 = ppDVar3[(long)(int)uVar6 + -1];
          pDVar8 = (DdNode *)((ulong)pDVar7 & 0xfffffffffffffffe);
          if ((ulong)pDVar8->index == 0x7fffffff) break;
          (gen->gen).cubes.cube[pDVar8->index] = 0;
          iVar4 = (gen->stack).sp;
          ppDVar3[iVar4] = (DdNode *)((ulong)(pDVar8->type).kids.E ^ 1);
          uVar5 = iVar4 + 1;
          uVar6 = (ulong)uVar5;
          (gen->stack).sp = uVar5;
        }
        if (pDVar1->zero != pDVar8) {
          gen->status = 1;
          (gen->gen).cubes.value = (pDVar8->type).value;
          *path = (gen->gen).cubes.cube;
          return 1;
        }
        while( true ) {
          if ((int)uVar6 == 1) goto LAB_00749ea0;
          pDVar8 = *(DdNode **)
                    ((uint *)((ulong)ppDVar3[(long)(int)uVar6 + -2] & 0xfffffffffffffffe) + 4);
          piVar2 = (gen->gen).cubes.cube;
          uVar5 = *(uint *)((ulong)ppDVar3[(long)(int)uVar6 + -2] & 0xfffffffffffffffe);
          if (pDVar8 != pDVar7) break;
          piVar2[uVar5] = 2;
          iVar4 = (gen->stack).sp;
          uVar5 = iVar4 - 1;
          uVar6 = (ulong)uVar5;
          (gen->stack).sp = uVar5;
          pDVar7 = ppDVar3[(long)iVar4 + -2];
        }
        piVar2[uVar5] = 1;
      } while( true );
    }
    piVar2[uVar5] = 2;
    iVar4 = (gen->stack).sp + -1;
    (gen->stack).sp = iVar4;
  } while( true );
}

Assistant:

int
Cudd_zddNextPath(
  DdGen * gen,
  int ** path)
{
    DdNode *top, *next, *prev;
    DdManager *zdd = gen->manager;

    /* Backtrack from previously reached terminal node. */
    while (1) {
        if (gen->stack.sp == 1) {
            /* The current node has no predecessor. */
            gen->status = CUDD_GEN_EMPTY;
            gen->stack.sp--;
            goto done;
        }
        top = gen->stack.stack[gen->stack.sp-1];
        prev = Cudd_Regular(gen->stack.stack[gen->stack.sp-2]);
        next = cuddT(prev);
        if (next != top) { /* follow the then branch next */
            gen->gen.cubes.cube[prev->index] = 1;
            gen->stack.stack[gen->stack.sp-1] = next;
            break;
        }
        /* Pop the stack and try again. */
        gen->gen.cubes.cube[prev->index] = 2;
        gen->stack.sp--;
    }

    while (1) {
        top = gen->stack.stack[gen->stack.sp-1];
        if (!cuddIsConstant(Cudd_Regular(top))) {
            /* Take the else branch first. */
            gen->gen.cubes.cube[Cudd_Regular(top)->index] = 0;
            next = cuddE(Cudd_Regular(top));
            gen->stack.stack[gen->stack.sp] = Cudd_Not(next); gen->stack.sp++;
        } else if (Cudd_Regular(top) == DD_ZERO(zdd)) {
            /* Backtrack. */
            while (1) {
                if (gen->stack.sp == 1) {
                    /* The current node has no predecessor. */
                    gen->status = CUDD_GEN_EMPTY;
                    gen->stack.sp--;
                    goto done;
                }
                prev = Cudd_Regular(gen->stack.stack[gen->stack.sp-2]);
                next = cuddT(prev);
                if (next != top) { /* follow the then branch next */
                    gen->gen.cubes.cube[prev->index] = 1;
                    gen->stack.stack[gen->stack.sp-1] = next;
                    break;
                }
                /* Pop the stack and try again. */
                gen->gen.cubes.cube[prev->index] = 2;
                gen->stack.sp--;
                top = gen->stack.stack[gen->stack.sp-1];
            }
        } else {
            gen->status = CUDD_GEN_NONEMPTY;
            gen->gen.cubes.value = cuddV(Cudd_Regular(top));
            goto done;
        }
    }

done:
    if (gen->status == CUDD_GEN_EMPTY) return(0);
    *path = gen->gen.cubes.cube;
    return(1);

}